

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

StringFeatureType * __thiscall
CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(DictionaryFeatureType *this)

{
  StringFeatureType *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    this_00 = (StringFeatureType *)(this->KeyType_).int64keytype_;
  }
  else {
    clear_KeyType(this);
    this->_oneof_case_[0] = 2;
    this_00 = (StringFeatureType *)operator_new(0x18);
    StringFeatureType::StringFeatureType(this_00);
    (this->KeyType_).stringkeytype_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::StringFeatureType* DictionaryFeatureType::mutable_stringkeytype() {
  if (!has_stringkeytype()) {
    clear_KeyType();
    set_has_stringkeytype();
    KeyType_.stringkeytype_ = new ::CoreML::Specification::StringFeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictionaryFeatureType.stringKeyType)
  return KeyType_.stringkeytype_;
}